

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

void ctl_refresh(tsdn_t *tsdn)

{
  background_thread_stats_t *stats;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ctl_arena_t *ctl_sdarena;
  ctl_arena_stats_t *pcVar4;
  arena_t *arena;
  long lVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  ctl_stats_t *pcVar12;
  uint32_t uVar13;
  atomic_u32_t aVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ctl_stats_t *pcVar21;
  _Bool _Var22;
  int iVar23;
  ulong uVar24;
  ctl_arena_t *pcVar25;
  void *pvVar26;
  ulong uVar27;
  mutex_prof_data_t *data;
  size_t sVar28;
  long *in_FS_OFFSET;
  undefined1 auVar29 [16];
  long alStack_40 [2];
  
  uVar3 = ctl_arenas->narenas;
  uVar27 = (ulong)uVar3;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    alStack_40[0] = 0x115c4f9;
    duckdb_je_tsd_fetch_slow((tsd_t *)(*in_FS_OFFSET + -0x2a90),false);
  }
  ctl_sdarena = ctl_arenas->duckdb_je_arenas[0];
  lVar5 = -(uVar27 * 8 + 0xf & 0xfffffffffffffff0);
  ctl_sdarena->nthreads = 0;
  ctl_sdarena->dss = "N/A";
  *(undefined4 *)&ctl_sdarena->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&ctl_sdarena->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->muzzy_decay_ms + 4) = 0xffffffff;
  ctl_sdarena->pactive = 0;
  ctl_sdarena->pdirty = 0;
  ctl_sdarena->pmuzzy = 0;
  pcVar4 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c2b0;
  switchD_00569a20::default(pcVar4,0,0x9818);
  if (uVar27 != 0) {
    uVar24 = 0;
    do {
      pvVar26 = duckdb_je_arenas[uVar24].repr;
      if (pvVar26 == (void *)0x0) {
        pvVar26 = (void *)0x0;
      }
      *(void **)((long)alStack_40 + uVar24 * 8 + lVar5 + -0x38 + 0x40) = pvVar26;
      uVar24 = uVar24 + 1;
    } while (uVar27 != uVar24);
    if (uVar3 != 0) {
      sVar28 = 0;
      do {
        *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c2ea;
        pcVar25 = arenas_i(sVar28);
        arena = *(arena_t **)((long)alStack_40 + sVar28 * 8 + lVar5 + -0x38 + 0x40);
        pcVar25->initialized = arena != (arena_t *)0x0;
        if (arena != (arena_t *)0x0) {
          *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c309;
          ctl_arena_refresh(tsdn,arena,ctl_sdarena,(uint)sVar28,false);
        }
        sVar28 = sVar28 + 1;
      } while (uVar27 != sVar28);
    }
  }
  pcVar12 = ctl_stats;
  pcVar4 = ctl_sdarena->astats;
  ctl_stats->allocated = (pcVar4->astats).allocated_large + pcVar4->allocated_small;
  pcVar12->active = ctl_sdarena->pactive << 0xc;
  pcVar12->metadata = (pcVar4->astats).internal.repr + (pcVar4->astats).base;
  sVar28 = (pcVar4->astats).metadata_rtree;
  pcVar12->metadata_edata = (pcVar4->astats).metadata_edata;
  pcVar12->metadata_rtree = sVar28;
  uVar1 = (pcVar4->astats).resident;
  uVar2 = (pcVar4->astats).metadata_thp;
  auVar29._8_4_ = (int)uVar1;
  auVar29._0_8_ = uVar2;
  auVar29._12_4_ = (int)((ulong)uVar1 >> 0x20);
  pcVar12->metadata_thp = uVar2;
  pcVar12->resident = auVar29._8_8_;
  pcVar12->mapped = (pcVar4->astats).mapped;
  pcVar12->retained = (pcVar4->astats).pa_shard_stats.pac_stats.retained;
  stats = &pcVar12->background_thread;
  *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c37c;
  _Var22 = duckdb_je_background_thread_stats_read(tsdn,stats);
  if (_Var22) {
    (pcVar12->background_thread).max_counter_per_bg_thd.n_owner_switches = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.prev_owner = (tsdn_t *)0x0;
    (pcVar12->background_thread).max_counter_per_bg_thd.n_spin_acquired = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.max_n_thds = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.n_waiting_thds = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.max_wait_time = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.n_wait_times = 0;
    (pcVar12->background_thread).run_interval = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.tot_wait_time = 0;
    stats->num_threads = 0;
    stats->num_runs = 0;
    (pcVar12->background_thread).max_counter_per_bg_thd.n_lock_ops = 0;
    *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c3b9;
    duckdb_je_nstime_copy(&(pcVar12->background_thread).run_interval,&nstime_zero);
  }
  pcVar21 = ctl_stats;
  uVar6 = (pcVar12->background_thread).max_counter_per_bg_thd.tot_wait_time.ns;
  uVar7 = (pcVar12->background_thread).max_counter_per_bg_thd.max_wait_time.ns;
  uVar8 = (pcVar12->background_thread).max_counter_per_bg_thd.n_wait_times;
  uVar9 = (pcVar12->background_thread).max_counter_per_bg_thd.n_spin_acquired;
  uVar13 = (pcVar12->background_thread).max_counter_per_bg_thd.max_n_thds;
  aVar14.repr = (pcVar12->background_thread).max_counter_per_bg_thd.n_waiting_thds.repr;
  uVar10 = (pcVar12->background_thread).max_counter_per_bg_thd.n_owner_switches;
  uVar11 = (pcVar12->background_thread).max_counter_per_bg_thd.n_lock_ops;
  ctl_stats->mutex_prof_data[1].prev_owner =
       (pcVar12->background_thread).max_counter_per_bg_thd.prev_owner;
  pcVar21->mutex_prof_data[1].n_lock_ops = uVar11;
  pcVar21->mutex_prof_data[1].max_n_thds = uVar13;
  pcVar21->mutex_prof_data[1].n_waiting_thds = (atomic_u32_t)aVar14.repr;
  pcVar21->mutex_prof_data[1].n_owner_switches = uVar10;
  pcVar21->mutex_prof_data[1].n_wait_times = uVar8;
  pcVar21->mutex_prof_data[1].n_spin_acquired = uVar9;
  pcVar21->mutex_prof_data[1].tot_wait_time.ns = uVar6;
  pcVar21->mutex_prof_data[1].max_wait_time.ns = uVar7;
  pcVar21->mutex_prof_data[1].n_waiting_thds.repr = 0;
  *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c413;
  iVar23 = pthread_mutex_trylock
                     ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar23 != 0) {
    *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c41f;
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
  }
  pcVar12 = ctl_stats;
  uVar19 = duckdb_je_background_thread_lock.field_0.witness.link.qre_next;
  uVar18 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_spin_acquired;
  uVar17 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_wait_times;
  uVar16 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.max_wait_time.ns;
  uVar15 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.tot_wait_time.ns;
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar20 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches;
  ctl_stats->mutex_prof_data[0].prev_owner =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner;
  pcVar12->mutex_prof_data[0].n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops;
  *(undefined8 *)&pcVar12->mutex_prof_data[0].max_n_thds = uVar19;
  pcVar12->mutex_prof_data[0].n_owner_switches = uVar20;
  pcVar12->mutex_prof_data[0].n_wait_times = uVar17;
  pcVar12->mutex_prof_data[0].n_spin_acquired = uVar18;
  pcVar12->mutex_prof_data[0].tot_wait_time.ns = uVar15;
  pcVar12->mutex_prof_data[0].max_wait_time.ns = uVar16;
  pcVar12->mutex_prof_data[0].n_waiting_thds.repr = 0;
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  *(undefined8 *)((long)alStack_40 + lVar5) = 0x115c48d;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  pcVar12 = ctl_stats;
  uVar15 = ctl_mtx.field_0.field_0.prof_data.max_wait_time.ns;
  ctl_stats->mutex_prof_data[2].tot_wait_time.ns =
       (uint64_t)ctl_mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  pcVar12->mutex_prof_data[2].max_wait_time.ns = uVar15;
  uVar15 = ctl_mtx.field_0.field_0.prof_data.n_spin_acquired;
  pcVar12->mutex_prof_data[2].n_wait_times = ctl_mtx.field_0.field_0.prof_data.n_wait_times;
  pcVar12->mutex_prof_data[2].n_spin_acquired = uVar15;
  uVar15 = ctl_mtx.field_0.field_0.prof_data.n_owner_switches;
  *(witness_t **)&pcVar12->mutex_prof_data[2].max_n_thds = ctl_mtx.field_0.witness.link.qre_next;
  pcVar12->mutex_prof_data[2].n_owner_switches = uVar15;
  uVar15 = ctl_mtx.field_0.field_0.prof_data.n_lock_ops;
  pcVar12->mutex_prof_data[2].prev_owner = ctl_mtx.field_0.field_0.prof_data.prev_owner;
  pcVar12->mutex_prof_data[2].n_lock_ops = uVar15;
  pcVar12->mutex_prof_data[2].n_waiting_thds.repr = 0;
  ctl_arenas->epoch = ctl_arenas->epoch + 1;
  return;
}

Assistant:

static void
ctl_refresh(tsdn_t *tsdn) {
	malloc_mutex_assert_owner(tsdn, &ctl_mtx);
	/*
	 * We are guaranteed that `ctl_arenas->narenas` will not change
	 * underneath us since we hold `ctl_mtx` for the duration of this
	 * function. Unfortunately static analysis tools do not understand this,
	 * so we are extracting `narenas` into a local variable solely for the
	 * sake of exposing this information to such tools.
	 */
	const unsigned narenas = ctl_arenas->narenas;
	assert(narenas > 0);
	ctl_arena_t *ctl_sarena = arenas_i(MALLCTL_ARENAS_ALL);
	VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

	/*
	 * Clear sum stats, since they will be merged into by
	 * ctl_arena_refresh().
	 */
	ctl_arena_clear(ctl_sarena);

	for (unsigned i = 0; i < narenas; i++) {
		tarenas[i] = arena_get(tsdn, i, false);
	}

	for (unsigned i = 0; i < narenas; i++) {
		ctl_arena_t *ctl_arena = arenas_i(i);
		bool initialized = (tarenas[i] != NULL);

		ctl_arena->initialized = initialized;
		if (initialized) {
			ctl_arena_refresh(tsdn, tarenas[i], ctl_sarena, i,
			    false);
		}
	}

	if (config_stats) {
		ctl_stats->allocated = ctl_sarena->astats->allocated_small +
		    ctl_sarena->astats->astats.allocated_large;
		ctl_stats->active = (ctl_sarena->pactive << LG_PAGE);
		ctl_stats->metadata = ctl_sarena->astats->astats.base +
		    atomic_load_zu(&ctl_sarena->astats->astats.internal,
			ATOMIC_RELAXED);
		ctl_stats->metadata_edata = ctl_sarena->astats->astats
		    .metadata_edata;
		ctl_stats->metadata_rtree = ctl_sarena->astats->astats
		    .metadata_rtree;
		ctl_stats->resident = ctl_sarena->astats->astats.resident;
		ctl_stats->metadata_thp =
		    ctl_sarena->astats->astats.metadata_thp;
		ctl_stats->mapped = ctl_sarena->astats->astats.mapped;
		ctl_stats->retained = ctl_sarena->astats->astats
		    .pa_shard_stats.pac_stats.retained;

		ctl_background_thread_stats_read(tsdn);

#define READ_GLOBAL_MUTEX_PROF_DATA(i, mtx)				\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_read(tsdn, &ctl_stats->mutex_prof_data[i], &mtx);	\
    malloc_mutex_unlock(tsdn, &mtx);

		if (config_prof && opt_prof) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof, bt2gctx_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_thds_data, tdatas_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_dump, prof_dump_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_recent_alloc,
			    prof_recent_alloc_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_recent_dump,
			    prof_recent_dump_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_stats, prof_stats_mtx);
		}
		if (have_background_thread) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_background_thread,
			    background_thread_lock);
		} else {
			memset(&ctl_stats->mutex_prof_data[
			    global_prof_mutex_background_thread], 0,
			    sizeof(mutex_prof_data_t));
		}
		/* We own ctl mutex already. */
		malloc_mutex_prof_read(tsdn,
		    &ctl_stats->mutex_prof_data[global_prof_mutex_ctl],
		    &ctl_mtx);
#undef READ_GLOBAL_MUTEX_PROF_DATA
	}
	ctl_arenas->epoch++;
}